

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util_test.cc
# Opt level: O3

string * __thiscall
google::protobuf::util::SnakeCaseCamelCaseTest::CamelCaseToSnakeCase
          (string *__return_storage_ptr__,SnakeCaseCamelCaseTest *this,string *input)

{
  bool bVar1;
  string *in_RCX;
  string_view input_00;
  _Alloc_hider local_30;
  size_type local_28;
  char local_20;
  undefined7 uStack_1f;
  undefined8 uStack_18;
  
  local_28 = 0;
  local_20 = '\0';
  input_00._M_str = (char *)&local_30;
  input_00._M_len = (size_t)(input->_M_dataplus)._M_p;
  local_30._M_p = &local_20;
  bVar1 = FieldMaskUtil::CamelCaseToSnakeCase
                    ((FieldMaskUtil *)input->_M_string_length,input_00,in_RCX);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (bVar1) {
    if (local_30._M_p == &local_20) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1f,local_20);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_18;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_30._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1f,local_20);
    }
    __return_storage_ptr__->_M_string_length = local_28;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"#FAIL#","");
    if (local_30._M_p != &local_20) {
      operator_delete(local_30._M_p,CONCAT71(uStack_1f,local_20) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CamelCaseToSnakeCase(const std::string& input) {
    std::string output;
    if (FieldMaskUtil::CamelCaseToSnakeCase(input, &output)) {
      return output;
    } else {
      return "#FAIL#";
    }
  }